

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O0

uint __thiscall UnifiedRegex::CharSet<char16_t>::Count(CharSet<char16_t> *this)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  int local_28;
  CharSet<char16_t> *this_local;
  
  bVar3 = IsCompact(this);
  if (bVar3) {
    this_local._4_4_ = (int)(this->rep).compact.countPlusOne - 1;
  }
  else if ((this->rep).compact.countPlusOne == 0) {
    this_local._4_4_ = CharBitvec::Count(&(this->rep).full.direct);
  }
  else {
    if ((undefined8 *)(this->rep).compact.countPlusOne != &CharSetFull::Instance) {
      pCVar1 = (this->rep).full.root;
      uVar4 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2);
      if (0xff00 < uVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    uVar5 = CharBitvec::Count(&(this->rep).full.direct);
    if ((undefined8 *)(this->rep).compact.countPlusOne == &CharSetFull::Instance) {
      local_28 = 0xff00;
    }
    else {
      pCVar1 = (this->rep).full.root;
      local_28 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2);
    }
    this_local._4_4_ = uVar5 + local_28;
  }
  return this_local._4_4_;
}

Assistant:

inline uint Count() const
        {
            if (IsCompact())
            {
                return (uint)rep.compact.countPlusOne - 1;
            }
            else if (rep.full.root == 0)
            {
                return rep.full.direct.Count();
            }
            else
            {
                //The bit vector
                Assert(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00);
                return rep.full.direct.Count() + (rep.full.root == CharSetFull::TheFullNode ? 0xFF00 : rep.full.root->Count(CharSetNode::levels - 1));
            }
        }